

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CriticalSectionsBuilder.cpp
# Opt level: O2

void __thiscall CriticalSection::CriticalSection(CriticalSection *this,LockNode *lock)

{
  _Rb_tree_header *p_Var1;
  
  this->lock_ = lock;
  p_Var1 = &(this->nodes_)._M_t._M_impl.super__Rb_tree_header;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->nodes_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

CriticalSection::CriticalSection(LockNode *lock) : lock_(lock) {}